

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerCPP::emit_resources(CompilerCPP *this)

{
  bool bVar1;
  Types TVar2;
  uint32_t uVar3;
  SPIRConstantOp *constant;
  mapped_type *pmVar4;
  SPIREntryPoint *pSVar5;
  byte local_201;
  string local_1e8;
  SPIRVariable *local_1c8;
  SPIRVariable *var_5;
  uint *puStack_1b8;
  uint global_1;
  uint *__end1_8;
  uint *__begin1_8;
  SmallVector<unsigned_int,_8UL> *__range1_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *reg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__end1_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__begin1_7;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *__range1_7;
  SPIRVariable *var_4;
  uint *puStack_170;
  uint global;
  uint *__end1_6;
  uint *__begin1_6;
  SmallVector<unsigned_int,_8UL> *__range1_6;
  SPIRType *pSStack_150;
  bool emitted;
  SPIRType *type_4;
  SPIRVariable *var_3;
  Variant *id_5;
  Variant *__end1_5;
  Variant *__begin1_5;
  SmallVector<spirv_cross::Variant,_8UL> *__range1_5;
  SPIRType *type_3;
  SPIRVariable *var_2;
  Variant *id_4;
  Variant *__end1_4;
  Variant *__begin1_4;
  SmallVector<spirv_cross::Variant,_8UL> *__range1_4;
  SPIRType *type_2;
  SPIRVariable *var_1;
  Variant *id_3;
  Variant *__end1_3;
  Variant *__begin1_3;
  SmallVector<spirv_cross::Variant,_8UL> *__range1_3;
  SPIRType *type_1;
  SPIRVariable *var;
  Variant *id_2;
  Variant *__end1_2;
  Variant *__begin1_2;
  SmallVector<spirv_cross::Variant,_8UL> *__range1_2;
  SPIRType *type;
  Variant *id_1;
  Variant *__end1_1;
  Variant *__begin1_1;
  SmallVector<spirv_cross::Variant,_8UL> *__range1_1;
  string local_60;
  byte local_39;
  SPIRConstant *pSStack_38;
  bool needs_declaration;
  SPIRConstant *c;
  Variant *id;
  Variant *__end1;
  Variant *__begin1;
  SmallVector<spirv_cross::Variant,_8UL> *__range1;
  CompilerCPP *this_local;
  
  __begin1 = (Variant *)&(this->super_CompilerGLSL).super_Compiler.ir.ids;
  __range1 = (SmallVector<spirv_cross::Variant,_8UL> *)this;
  __end1 = VectorView<spirv_cross::Variant>::begin((VectorView<spirv_cross::Variant> *)__begin1);
  id = VectorView<spirv_cross::Variant>::end((VectorView<spirv_cross::Variant> *)__begin1);
  for (; __end1 != id; __end1 = __end1 + 1) {
    c = (SPIRConstant *)__end1;
    TVar2 = Variant::get_type(__end1);
    if (TVar2 == TypeConstant) {
      pSStack_38 = Variant::get<spirv_cross::SPIRConstant>((Variant *)c);
      local_201 = 1;
      if ((pSStack_38->specialization & 1U) == 0) {
        local_201 = pSStack_38->is_used_as_lut;
      }
      local_39 = local_201 & 1;
      if (local_39 != 0) {
        if ((((this->super_CompilerGLSL).options.vulkan_semantics & 1U) == 0) &&
           ((pSStack_38->specialization & 1U) != 0)) {
          __range1_1._4_4_ = (pSStack_38->super_IVariant).self.id;
          uVar3 = Compiler::get_decoration((Compiler *)this,__range1_1._4_4_,DecorationSpecId);
          CompilerGLSL::constant_value_macro_name_abi_cxx11_
                    (&local_60,&this->super_CompilerGLSL,uVar3);
          ::std::__cxx11::string::operator=
                    ((string *)&pSStack_38->specialization_constant_macro_name,(string *)&local_60);
          ::std::__cxx11::string::~string((string *)&local_60);
        }
        CompilerGLSL::emit_constant(&this->super_CompilerGLSL,pSStack_38);
      }
    }
    else {
      TVar2 = Variant::get_type((Variant *)c);
      if (TVar2 == TypeConstantOp) {
        constant = Variant::get<spirv_cross::SPIRConstantOp>((Variant *)c);
        CompilerGLSL::emit_specialization_constant_op(&this->super_CompilerGLSL,constant);
      }
    }
  }
  __begin1_1 = (Variant *)&(this->super_CompilerGLSL).super_Compiler.ir.ids;
  __end1_1 = VectorView<spirv_cross::Variant>::begin((VectorView<spirv_cross::Variant> *)__begin1_1)
  ;
  id_1 = VectorView<spirv_cross::Variant>::end((VectorView<spirv_cross::Variant> *)__begin1_1);
  for (; __end1_1 != id_1; __end1_1 = __end1_1 + 1) {
    type = (SPIRType *)__end1_1;
    TVar2 = Variant::get_type(__end1_1);
    if ((((TVar2 == TypeType) &&
         (__range1_2 = (SmallVector<spirv_cross::Variant,_8UL> *)
                       Variant::get<spirv_cross::SPIRType>((Variant *)type),
         ((SPIRType *)__range1_2)->basetype == Struct)) &&
        (bVar1 = VectorView<unsigned_int>::empty
                           (&(((SPIRType *)__range1_2)->array).super_VectorView<unsigned_int>),
        bVar1)) && (((__range1_2->stack_storage).aligned_char[100] & 1U) == 0)) {
      pmVar4 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                            (key_type *)
                            &(__range1_2->super_VectorView<spirv_cross::Variant>).buffer_size);
      bVar1 = Bitset::get(&(pmVar4->decoration).decoration_flags,2);
      if (!bVar1) {
        pmVar4 = ::std::
                 unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                 ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                              (key_type *)
                              &(__range1_2->super_VectorView<spirv_cross::Variant>).buffer_size);
        bVar1 = Bitset::get(&(pmVar4->decoration).decoration_flags,3);
        if (!bVar1) {
          CompilerGLSL::emit_struct(&this->super_CompilerGLSL,(SPIRType *)__range1_2);
        }
      }
    }
  }
  CompilerGLSL::statement<char_const(&)[20],std::__cxx11::string&>
            (&this->super_CompilerGLSL,(char (*) [20])"struct Resources : ",&this->resource_type);
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  __begin1_2 = (Variant *)&(this->super_CompilerGLSL).super_Compiler.ir.ids;
  __end1_2 = VectorView<spirv_cross::Variant>::begin((VectorView<spirv_cross::Variant> *)__begin1_2)
  ;
  id_2 = VectorView<spirv_cross::Variant>::end((VectorView<spirv_cross::Variant> *)__begin1_2);
  do {
    if (__end1_2 == id_2) {
      __begin1_3 = (Variant *)&(this->super_CompilerGLSL).super_Compiler.ir.ids;
      __end1_3 = VectorView<spirv_cross::Variant>::begin
                           ((VectorView<spirv_cross::Variant> *)__begin1_3);
      id_3 = VectorView<spirv_cross::Variant>::end((VectorView<spirv_cross::Variant> *)__begin1_3);
      for (; __end1_3 != id_3; __end1_3 = __end1_3 + 1) {
        var_1 = (SPIRVariable *)__end1_3;
        TVar2 = Variant::get_type(__end1_3);
        if (TVar2 == TypeVariable) {
          type_2 = (SPIRType *)Variant::get<spirv_cross::SPIRVariable>((Variant *)var_1);
          uVar3 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(type_2->super_IVariant).field_0xc);
          __range1_4 = (SmallVector<spirv_cross::Variant,_8UL> *)
                       Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
          bVar1 = Compiler::is_hidden_variable((Compiler *)this,(SPIRVariable *)type_2,false);
          if (((!bVar1) && (type_2->basetype != Int)) &&
             ((((__range1_4->stack_storage).aligned_char[100] & 1U) != 0 &&
              (*(int *)((__range1_4->stack_storage).aligned_char + 0x68) == 9)))) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x21])(this,type_2);
          }
        }
      }
      __begin1_4 = (Variant *)&(this->super_CompilerGLSL).super_Compiler.ir.ids;
      __end1_4 = VectorView<spirv_cross::Variant>::begin
                           ((VectorView<spirv_cross::Variant> *)__begin1_4);
      id_4 = VectorView<spirv_cross::Variant>::end((VectorView<spirv_cross::Variant> *)__begin1_4);
      for (; __end1_4 != id_4; __end1_4 = __end1_4 + 1) {
        var_2 = (SPIRVariable *)__end1_4;
        TVar2 = Variant::get_type(__end1_4);
        if (TVar2 == TypeVariable) {
          type_3 = (SPIRType *)Variant::get<spirv_cross::SPIRVariable>((Variant *)var_2);
          uVar3 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(type_3->super_IVariant).field_0xc);
          __range1_5 = (SmallVector<spirv_cross::Variant,_8UL> *)
                       Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
          if (((type_3->basetype != Int) &&
              (bVar1 = Compiler::is_hidden_variable((Compiler *)this,(SPIRVariable *)type_3,false),
              !bVar1)) &&
             ((((__range1_5->stack_storage).aligned_char[100] & 1U) != 0 &&
              ((type_3->basetype == Void || (type_3->basetype == SByte)))))) {
            uVar3 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(type_3->super_IVariant).self);
            bVar1 = Compiler::interface_variable_exists_in_entry_point((Compiler *)this,uVar3);
            if (bVar1) {
              emit_interface_block(this,(SPIRVariable *)type_3);
            }
          }
        }
      }
      __begin1_5 = (Variant *)&(this->super_CompilerGLSL).super_Compiler.ir.ids;
      __end1_5 = VectorView<spirv_cross::Variant>::begin
                           ((VectorView<spirv_cross::Variant> *)__begin1_5);
      id_5 = VectorView<spirv_cross::Variant>::end((VectorView<spirv_cross::Variant> *)__begin1_5);
      for (; __end1_5 != id_5; __end1_5 = __end1_5 + 1) {
        var_3 = (SPIRVariable *)__end1_5;
        TVar2 = Variant::get_type(__end1_5);
        if (TVar2 == TypeVariable) {
          type_4 = (SPIRType *)Variant::get<spirv_cross::SPIRVariable>((Variant *)var_3);
          uVar3 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(type_4->super_IVariant).field_0xc);
          pSStack_150 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
          if ((((type_4->basetype != Int) &&
               (bVar1 = Compiler::is_hidden_variable((Compiler *)this,(SPIRVariable *)type_4,false),
               !bVar1)) && ((pSStack_150->pointer & 1U) != 0)) &&
             ((pSStack_150->storage == StorageClassUniformConstant ||
              (pSStack_150->storage == AtomicCounter)))) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x22])(this,type_4);
          }
        }
      }
      __range1_6._7_1_ = 0;
      __begin1_6 = (uint *)&(this->super_CompilerGLSL).super_Compiler.global_variables;
      __end1_6 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)__begin1_6);
      puStack_170 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin1_6);
      for (; __end1_6 != puStack_170; __end1_6 = __end1_6 + 1) {
        var_4._4_4_ = *__end1_6;
        __range1_7 = (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,var_4._4_4_);
        if (*(StorageClass *)&__range1_7->buffer_capacity == StorageClassWorkgroup) {
          emit_shared(this,(SPIRVariable *)__range1_7);
          __range1_6._7_1_ = 1;
        }
      }
      if ((__range1_6._7_1_ & 1) != 0) {
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x65adc5);
      }
      CompilerGLSL::statement<char_const(&)[40]>
                (&this->super_CompilerGLSL,(char (*) [40])"inline void init(spirv_cross_shader& s)")
      ;
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      CompilerGLSL::statement<std::__cxx11::string&,char_const(&)[11]>
                (&this->super_CompilerGLSL,&this->resource_type,(char (*) [11])"::init(s);");
      __begin1_7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &this->resource_registrations;
      __end1_7 = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::begin((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)__begin1_7);
      reg = VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::end((VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)__begin1_7);
      for (; __end1_7 != reg; __end1_7 = __end1_7 + 1) {
        __range1_8 = (SmallVector<unsigned_int,_8UL> *)__end1_7;
        CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,__end1_7);
      }
      CompilerGLSL::end_scope(&this->super_CompilerGLSL);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::clear(&this->resource_registrations);
      CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x65adc5);
      CompilerGLSL::statement<char_const(&)[18]>
                (&this->super_CompilerGLSL,(char (*) [18])"Resources* __res;");
      pSVar5 = Compiler::get_entry_point((Compiler *)this);
      if (pSVar5->model == ExecutionModelGLCompute) {
        CompilerGLSL::statement<char_const(&)[36]>
                  (&this->super_CompilerGLSL,(char (*) [36])"ComputePrivateResources __priv_res;");
      }
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x65adc5);
      __range1_6._7_1_ = 0;
      __begin1_8 = (uint *)&(this->super_CompilerGLSL).super_Compiler.global_variables;
      __end1_8 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)__begin1_8);
      puStack_1b8 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin1_8);
      for (; __end1_8 != puStack_1b8; __end1_8 = __end1_8 + 1) {
        var_5._4_4_ = *__end1_8;
        local_1c8 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,var_5._4_4_);
        if (local_1c8->storage == Private) {
          if (local_1c8->storage == StorageClassWorkgroup) {
            emit_shared(this,local_1c8);
          }
          else {
            CompilerGLSL::variable_decl_abi_cxx11_(&local_1e8,&this->super_CompilerGLSL,local_1c8);
            CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,&local_1e8,(char (*) [2])0x6815db);
            ::std::__cxx11::string::~string((string *)&local_1e8);
          }
          __range1_6._7_1_ = 1;
        }
      }
      if ((__range1_6._7_1_ & 1) != 0) {
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x65adc5);
      }
      return;
    }
    var = (SPIRVariable *)__end1_2;
    TVar2 = Variant::get_type(__end1_2);
    if (TVar2 == TypeVariable) {
      type_1 = (SPIRType *)Variant::get<spirv_cross::SPIRVariable>((Variant *)var);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_1->super_IVariant).field_0xc)
      ;
      __range1_3 = (SmallVector<spirv_cross::Variant,_8UL> *)
                   Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
      if (((type_1->basetype != Int) && ((((SPIRType *)__range1_3)->pointer & 1U) != 0)) &&
         ((((SPIRType *)__range1_3)->storage == StorageClassUniform &&
          (bVar1 = Compiler::is_hidden_variable((Compiler *)this,(SPIRVariable *)type_1,false),
          !bVar1)))) {
        pmVar4 = ::std::
                 unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                 ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                              (key_type *)
                              &(__range1_3->super_VectorView<spirv_cross::Variant>).buffer_size);
        bVar1 = Bitset::get(&(pmVar4->decoration).decoration_flags,2);
        if (!bVar1) {
          pmVar4 = ::std::
                   unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                   ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                                (key_type *)
                                &(__range1_3->super_VectorView<spirv_cross::Variant>).buffer_size);
          bVar1 = Bitset::get(&(pmVar4->decoration).decoration_flags,3);
          if (!bVar1) goto LAB_00505084;
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x20])(this,type_1);
      }
    }
LAB_00505084:
    __end1_2 = __end1_2 + 1;
  } while( true );
}

Assistant:

void CompilerCPP::emit_resources()
{
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeConstant)
		{
			auto &c = id.get<SPIRConstant>();

			bool needs_declaration = c.specialization || c.is_used_as_lut;

			if (needs_declaration)
			{
				if (!options.vulkan_semantics && c.specialization)
				{
					c.specialization_constant_macro_name =
					    constant_value_macro_name(get_decoration(c.self, DecorationSpecId));
				}
				emit_constant(c);
			}
		}
		else if (id.get_type() == TypeConstantOp)
		{
			emit_specialization_constant_op(id.get<SPIRConstantOp>());
		}
	}

	// Output all basic struct types which are not Block or BufferBlock as these are declared inplace
	// when such variables are instantiated.
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeType)
		{
			auto &type = id.get<SPIRType>();
			if (type.basetype == SPIRType::Struct && type.array.empty() && !type.pointer &&
			    (!ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) &&
			     !ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock)))
			{
				emit_struct(type);
			}
		}
	}

	statement("struct Resources : ", resource_type);
	begin_scope();

	// Output UBOs and SSBOs
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeVariable)
		{
			auto &var = id.get<SPIRVariable>();
			auto &type = get<SPIRType>(var.basetype);

			if (var.storage != StorageClassFunction && type.pointer && type.storage == StorageClassUniform &&
			    !is_hidden_variable(var) &&
			    (ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
			     ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock)))
			{
				emit_buffer_block(var);
			}
		}
	}

	// Output push constant blocks
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeVariable)
		{
			auto &var = id.get<SPIRVariable>();
			auto &type = get<SPIRType>(var.basetype);
			if (!is_hidden_variable(var) && var.storage != StorageClassFunction && type.pointer &&
			    type.storage == StorageClassPushConstant)
			{
				emit_push_constant_block(var);
			}
		}
	}

	// Output in/out interfaces.
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeVariable)
		{
			auto &var = id.get<SPIRVariable>();
			auto &type = get<SPIRType>(var.basetype);

			if (var.storage != StorageClassFunction && !is_hidden_variable(var) && type.pointer &&
			    (var.storage == StorageClassInput || var.storage == StorageClassOutput) &&
			    interface_variable_exists_in_entry_point(var.self))
			{
				emit_interface_block(var);
			}
		}
	}

	// Output Uniform Constants (values, samplers, images, etc).
	for (auto &id : ir.ids)
	{
		if (id.get_type() == TypeVariable)
		{
			auto &var = id.get<SPIRVariable>();
			auto &type = get<SPIRType>(var.basetype);

			if (var.storage != StorageClassFunction && !is_hidden_variable(var) && type.pointer &&
			    (type.storage == StorageClassUniformConstant || type.storage == StorageClassAtomicCounter))
			{
				emit_uniform(var);
			}
		}
	}

	// Global variables.
	bool emitted = false;
	for (auto global : global_variables)
	{
		auto &var = get<SPIRVariable>(global);
		if (var.storage == StorageClassWorkgroup)
		{
			emit_shared(var);
			emitted = true;
		}
	}

	if (emitted)
		statement("");

	statement("inline void init(spirv_cross_shader& s)");
	begin_scope();
	statement(resource_type, "::init(s);");
	for (auto &reg : resource_registrations)
		statement(reg);
	end_scope();
	resource_registrations.clear();

	end_scope_decl();

	statement("");
	statement("Resources* __res;");
	if (get_entry_point().model == ExecutionModelGLCompute)
		statement("ComputePrivateResources __priv_res;");
	statement("");

	// Emit regular globals which are allocated per invocation.
	emitted = false;
	for (auto global : global_variables)
	{
		auto &var = get<SPIRVariable>(global);
		if (var.storage == StorageClassPrivate)
		{
			if (var.storage == StorageClassWorkgroup)
				emit_shared(var);
			else
				statement(CompilerGLSL::variable_decl(var), ";");
			emitted = true;
		}
	}

	if (emitted)
		statement("");
}